

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::DescriptorScalarReplacement::CreateReplacementVariable
          (DescriptorScalarReplacement *this,Instruction *var,uint32_t idx)

{
  _Rb_tree_header *p_Var1;
  PodType (*paPVar2) [2];
  size_type *psVar3;
  Op OVar4;
  _Rb_tree_color _Var5;
  IRContext *pIVar6;
  Module *pMVar7;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
  *p_Var8;
  _Base_ptr p_Var9;
  pointer pOVar10;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  _Var11;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  _Var12;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> inst;
  size_type sVar13;
  pointer puVar14;
  PodType storage_class;
  uint32_t uVar15;
  PodType res_id;
  uint uVar16;
  Analysis AVar17;
  Instruction *pIVar18;
  Instruction *pIVar19;
  pointer __p;
  long *plVar20;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_> _Var21;
  uint uVar22;
  pointer *__ptr;
  long lVar23;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_00;
  Instruction *pIVar24;
  undefined8 uVar25;
  _Alloc_hider _Var26;
  uint uVar27;
  Instruction *debug_inst;
  _Base_ptr p_Var28;
  uint *puVar29;
  uint *pos;
  _Base_ptr p_Var30;
  uint *puVar31;
  ulong uVar32;
  pointer puVar33;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
  pVar34;
  undefined1 local_180 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_160;
  string result_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_130;
  undefined4 local_128 [2];
  undefined1 local_120 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_100;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result_2;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_> local_d0;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_c0;
  ulong local_b8 [4];
  string name_str;
  undefined1 local_78 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_58;
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  names_to_add;
  
  uVar15 = (var->has_result_id_ & 1) + 1;
  if (var->has_type_id_ == false) {
    uVar15 = (uint)var->has_result_id_;
  }
  storage_class.data._M_elems =
       (array<signed_char,_4UL>)Instruction::GetSingleWordOperand(var,uVar15);
  uVar15 = 0;
  if (var->has_type_id_ == true) {
    uVar15 = Instruction::GetSingleWordOperand(var,0);
  }
  pIVar6 = (this->super_Pass).context_;
  if ((pIVar6->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar6);
  }
  pIVar18 = analysis::DefUseManager::GetDef
                      ((pIVar6->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,uVar15);
  if (pIVar18->opcode_ != OpTypePointer) {
    __assert_fail("ptr_type_inst->opcode() == spv::Op::OpTypePointer && \"Variable should be a pointer to an array or structure.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/desc_sroa.cpp"
                  ,0x129,
                  "uint32_t spvtools::opt::DescriptorScalarReplacement::CreateReplacementVariable(Instruction *, uint32_t)"
                 );
  }
  uVar27 = (pIVar18->has_result_id_ & 1) + 1;
  if (pIVar18->has_type_id_ == false) {
    uVar27 = (uint)pIVar18->has_result_id_;
  }
  uVar15 = Instruction::GetSingleWordOperand(pIVar18,uVar27 + 1);
  pIVar6 = (this->super_Pass).context_;
  if ((pIVar6->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar6);
  }
  pIVar18 = analysis::DefUseManager::GetDef
                      ((pIVar6->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,uVar15);
  OVar4 = pIVar18->opcode_;
  if ((OVar4 | OpSourceContinued) != OpTypeStruct) {
    __assert_fail("(is_array || is_struct) && \"Variable should be a pointer to an array or structure.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/desc_sroa.cpp"
                  ,0x12f,
                  "uint32_t spvtools::opt::DescriptorScalarReplacement::CreateReplacementVariable(Instruction *, uint32_t)"
                 );
  }
  uVar27 = (pIVar18->has_result_id_ & 1) + 1;
  if (pIVar18->has_type_id_ == false) {
    uVar27 = (uint)pIVar18->has_result_id_;
  }
  uVar15 = 0;
  if (OVar4 != OpTypeArray) {
    uVar15 = idx;
  }
  uVar15 = Instruction::GetSingleWordOperand(pIVar18,uVar15 + uVar27);
  pIVar6 = (this->super_Pass).context_;
  if ((pIVar6->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(pIVar6);
  }
  uVar15 = analysis::TypeManager::FindPointerToType
                     ((pIVar6->type_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                      _M_head_impl,uVar15,(StorageClass)storage_class.data._M_elems);
  res_id.data._M_elems = (array<signed_char,_4UL>)Pass::TakeNextId(&this->super_Pass);
  pIVar19 = (Instruction *)operator_new(0x70);
  pIVar6 = (this->super_Pass).context_;
  local_180._24_8_ = local_180 + 0x10;
  local_180._0_8_ = &PTR__SmallVector_00b02ef8;
  local_160._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_180._16_4_ = storage_class.data._M_elems;
  local_180._8_8_ = 1;
  result_1._M_dataplus._M_p._0_4_ = 0x11;
  result_1._M_string_length = (size_type)&PTR__SmallVector_00b02ef8;
  result_1.field_2._M_allocated_capacity = 0;
  local_130 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)&result_1._M_string_length,
             (SmallVector<unsigned_int,_2UL> *)local_180);
  local_78._0_8_ = (undefined **)0x0;
  local_78._8_8_ = 0;
  local_78._16_8_ = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)local_78,
             &result_1,local_128);
  Instruction::Instruction
            (pIVar19,pIVar6,OpVariable,uVar15,(uint32_t)res_id.data._M_elems,(OperandList *)local_78
            );
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_78);
  result_1._M_string_length = (size_type)&PTR__SmallVector_00b02ef8;
  if (local_130 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_130,local_130);
  }
  local_130 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_180._0_8_ = &PTR__SmallVector_00b02ef8;
  if (local_160._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_160,local_160._M_head_impl);
  }
  pIVar6 = (this->super_Pass).context_;
  if ((pIVar6->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
    analysis::DefUseManager::AnalyzeInstDefUse
              ((pIVar6->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               pIVar19);
  }
  utils::IntrusiveList<spvtools::opt::Instruction>::push_back
            (&(((pIVar6->module_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->types_values_)
              .super_IntrusiveList<spvtools::opt::Instruction>,pIVar19);
  CopyDecorationsForNewVariable
            (this,var,idx,(uint32_t)res_id.data._M_elems,uVar15,OVar4 == OpTypeArray,
             OVar4 == OpTypeStruct,pIVar18);
  names_to_add.
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  names_to_add.
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  names_to_add.
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar6 = (this->super_Pass).context_;
  uVar15 = 0;
  if (var->has_result_id_ == true) {
    uVar15 = Instruction::GetSingleWordOperand(var,(uint)var->has_type_id_);
  }
  local_180._0_4_ = uVar15;
  if ((pIVar6->valid_analyses_ & kAnalysisNameMap) == kAnalysisNone) {
    __p = (pointer)operator_new(0x30);
    p_Var1 = &(__p->_M_t)._M_impl.super__Rb_tree_header;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    *(undefined8 *)&(__p->_M_t)._M_impl = 0;
    *(undefined8 *)&(__p->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    std::
    __uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
    ::reset((__uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
             *)&pIVar6->id_to_name_,__p);
    pMVar7 = (pIVar6->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    pIVar19 = (pMVar7->debugs2_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
              super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    pIVar24 = &(pMVar7->debugs2_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
    if (pIVar19 != pIVar24) {
      do {
        if (pIVar19->opcode_ - OpName < 2) {
          p_Var8 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
                    *)(pIVar6->id_to_name_)._M_t.
                      super___uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                      .
                      super__Head_base<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_false>
                      ._M_head_impl;
          uVar15 = (pIVar19->has_result_id_ & 1) + 1;
          if (pIVar19->has_type_id_ == false) {
            uVar15 = (uint)pIVar19->has_result_id_;
          }
          uVar15 = Instruction::GetSingleWordOperand(pIVar19,uVar15);
          result_1._M_dataplus._M_p._0_4_ = uVar15;
          result_1._M_string_length = (size_type)pIVar19;
          std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
          ::_M_insert_equal<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>
                    (p_Var8,(pair<const_unsigned_int,_spvtools::opt::Instruction_*> *)&result_1);
        }
        pIVar19 = (pIVar19->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      } while (pIVar19 != pIVar24);
    }
    *(undefined1 *)&pIVar6->valid_analyses_ = (char)pIVar6->valid_analyses_ | kAnalysisNameMap;
  }
  pVar34 = std::
           _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::_Select1st<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
           ::equal_range(&((pIVar6->id_to_name_)._M_t.
                           super___uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                           .
                           super__Head_base<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_false>
                          ._M_head_impl)->_M_t,(key_type_conflict *)local_180);
  if (pVar34.first._M_node._M_node == pVar34.second._M_node._M_node) {
LAB_0055d2ba:
    puVar14 = names_to_add.
              super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (names_to_add.
        super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        names_to_add.
        super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      puVar33 = names_to_add.
                super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        pIVar6 = (this->super_Pass).context_;
        AVar17 = pIVar6->valid_analyses_;
        if (((char)AVar17 < '\0') &&
           (pIVar18 = (puVar33->_M_t).
                      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,
           pIVar18->opcode_ - OpName < 2)) {
          p_Var8 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
                    *)(pIVar6->id_to_name_)._M_t.
                      super___uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                      .
                      super__Head_base<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_false>
                      ._M_head_impl;
          uVar15 = (pIVar18->has_result_id_ & 1) + 1;
          if (pIVar18->has_type_id_ == false) {
            uVar15 = (uint)pIVar18->has_result_id_;
          }
          uVar15 = Instruction::GetSingleWordOperand(pIVar18,uVar15);
          result_1._M_string_length =
               (size_type)
               (puVar33->_M_t).
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
          result_1._M_dataplus._M_p._0_4_ = uVar15;
          std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
          ::_M_insert_equal<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>
                    (p_Var8,(pair<const_unsigned_int,_spvtools::opt::Instruction_*> *)&result_1);
          AVar17 = pIVar6->valid_analyses_;
        }
        if ((AVar17 & kAnalysisBegin) != kAnalysisNone) {
          analysis::DefUseManager::AnalyzeInstDefUse
                    ((pIVar6->def_use_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                     _M_head_impl,
                     (puVar33->_M_t).
                     super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                     .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
        }
        pIVar18 = (puVar33->_M_t).
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        pMVar7 = (pIVar6->module_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                 .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
        (puVar33->_M_t).
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
             (Instruction *)0x0;
        utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                  (&(pMVar7->debugs2_).super_IntrusiveList<spvtools::opt::Instruction>,pIVar18);
        puVar33 = puVar33 + 1;
      } while (puVar33 != puVar14);
    }
    std::
    vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
    ::~vector(&names_to_add);
    return (uint32_t)res_id.data._M_elems;
  }
LAB_0055cc0a:
  local_d0 = pVar34.second._M_node;
  p_Var30 = pVar34.first._M_node._M_node[1]._M_parent;
  p_Var28 = p_Var30[1]._M_right;
  if ((ulong)((*(long *)(p_Var30 + 2) - (long)p_Var28 >> 4) * -0x5555555555555555) < 2) {
LAB_0055d3af:
    __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                  ,0x2a0,"Operand &spvtools::opt::Instruction::GetOperand(uint32_t)");
  }
  p_Var9 = p_Var28[2]._M_right;
  p_Var30 = (_Base_ptr)&p_Var28[2]._M_left;
  if (p_Var9 == (_Base_ptr)0x0) {
    p_Var28 = (_Base_ptr)(&(p_Var28[2]._M_left)->_M_color + *(long *)(p_Var28 + 2));
  }
  else {
    p_Var28 = p_Var9->_M_parent;
    p_Var30 = p_Var9;
  }
  p_Var30 = *(_Base_ptr *)p_Var30;
  name_str._M_string_length = 0;
  name_str.field_2._M_local_buf[0] = '\0';
  name_str._M_dataplus._M_p = (pointer)&name_str.field_2;
  for (; p_Var30 != p_Var28; p_Var30 = (_Base_ptr)&p_Var30->field_0x4) {
    _Var5 = p_Var30->_M_color;
    lVar23 = 0;
    do {
      if ((char)(_Var5 >> ((byte)lVar23 & 0x1f)) == '\0') {
        if (OVar4 == OpTypeArray) {
          utils::ToString<unsigned_int>((string *)local_78,idx);
          plVar20 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x90f3b8);
          paPVar2 = (PodType (*) [2])(plVar20 + 2);
          if ((PodType (*) [2])*plVar20 == paPVar2) {
            local_180._16_8_ = *paPVar2;
            local_180._24_8_ = plVar20[3];
            local_180._0_8_ = (PodType (*) [2])(local_180 + 0x10);
          }
          else {
            local_180._16_8_ = *paPVar2;
            local_180._0_8_ = (PodType (*) [2])*plVar20;
          }
          local_180._8_8_ = plVar20[1];
          *plVar20 = (long)paPVar2;
          plVar20[1] = 0;
          *(undefined1 *)(plVar20 + 2) = 0;
          plVar20 = (long *)std::__cxx11::string::append(local_180);
          psVar3 = (size_type *)(plVar20 + 2);
          if ((size_type *)*plVar20 == psVar3) {
            result_1.field_2._M_allocated_capacity = *psVar3;
            result_1.field_2._8_8_ = plVar20[3];
            result_1._M_dataplus._M_p = (pointer)&result_1.field_2;
          }
          else {
            result_1.field_2._M_allocated_capacity = *psVar3;
            result_1._M_dataplus._M_p = (pointer)*plVar20;
          }
          result_1._M_string_length = plVar20[1];
          *plVar20 = (long)psVar3;
          plVar20[1] = 0;
          *(undefined1 *)(plVar20 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&name_str,(ulong)result_1._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)result_1._M_dataplus._M_p != &result_1.field_2) {
            operator_delete(result_1._M_dataplus._M_p,result_1.field_2._M_allocated_capacity + 1);
          }
          if ((PodType (*) [2])local_180._0_8_ != (PodType (*) [2])(local_180 + 0x10)) {
            operator_delete((void *)local_180._0_8_,(ulong)(local_180._16_8_ + 1));
          }
          uVar25 = local_78._16_8_;
          _Var26._M_p = (pointer)local_78._0_8_;
          if ((undefined1 *)local_78._0_8_ == local_78 + 0x10) goto LAB_0055cf6f;
        }
        else {
          if (OVar4 != OpTypeStruct) goto LAB_0055cf6f;
          pIVar6 = (this->super_Pass).context_;
          uVar15 = 0;
          if (pIVar18->has_result_id_ == true) {
            uVar15 = Instruction::GetSingleWordOperand(pIVar18,(uint)pIVar18->has_type_id_);
          }
          pIVar19 = IRContext::GetMemberName(pIVar6,uVar15,idx);
          std::__cxx11::string::append((char *)&name_str);
          if (pIVar19 != (Instruction *)0x0) {
            pOVar10 = (pIVar19->operands_).
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)(((long)(pIVar19->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar10 >> 4) *
                       -0x5555555555555555) < 3) goto LAB_0055d3af;
            _Var11._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl =
                 pOVar10[2].words.large_data_._M_t.
                 super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_t;
            _Var12._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl =
                 (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )&pOVar10[2].words.small_data_;
            if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )_Var11._M_t.
                  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  .
                  super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                  ._M_head_impl == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
              puVar29 = pOVar10[2].words.small_data_ + pOVar10[2].words.size_;
            }
            else {
              puVar29 = *(uint **)((long)_Var11._M_t.
                                         super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                         ._M_head_impl + 8);
              _Var12._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
              ._M_head_impl =
                   _Var11._M_t.
                   super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                   ._M_head_impl;
            }
            result_1._M_dataplus._M_p = (pointer)&result_1.field_2;
            puVar31 = *(uint **)_Var12._M_t.
                                super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                .
                                super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                ._M_head_impl;
            result_1._M_string_length = 0;
            result_1.field_2._M_allocated_capacity =
                 result_1.field_2._M_allocated_capacity & 0xffffffffffffff00;
            goto LAB_0055cf06;
          }
          utils::ToString<unsigned_int>(&result_1,idx);
          std::__cxx11::string::_M_append((char *)&name_str,(ulong)result_1._M_dataplus._M_p);
          uVar25 = result_1.field_2._M_allocated_capacity;
          _Var26 = result_1._M_dataplus;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)result_1._M_dataplus._M_p == &result_1.field_2) goto LAB_0055cf6f;
        }
        operator_delete(_Var26._M_p,uVar25 + 1);
        goto LAB_0055cf6f;
      }
      std::__cxx11::string::push_back((char)&name_str);
      lVar23 = lVar23 + 8;
    } while (lVar23 != 0x20);
  }
LAB_0055d390:
  __assert_fail("!assert_found_terminating_null && \"Did not find terminating null for the string.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/string_utils.h"
                ,0x65,
                "std::string spvtools::utils::MakeString(InputIt, InputIt, bool) [InputIt = const unsigned int *]"
               );
LAB_0055cf06:
  if (puVar31 == puVar29) goto LAB_0055d390;
  uVar27 = *puVar31;
  lVar23 = 0;
  while ((char)(uVar27 >> ((byte)lVar23 & 0x1f)) != '\0') {
    std::__cxx11::string::push_back((char)&result_1);
    lVar23 = lVar23 + 8;
    if (lVar23 == 0x20) goto code_r0x0055cf36;
  }
  std::__cxx11::string::_M_append((char *)&name_str,(ulong)result_1._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result_1._M_dataplus._M_p != &result_1.field_2) {
    operator_delete(result_1._M_dataplus._M_p,result_1.field_2._M_allocated_capacity + 1);
  }
LAB_0055cf6f:
  pIVar19 = (Instruction *)operator_new(0x70);
  pIVar6 = (this->super_Pass).context_;
  local_180._0_8_ = &PTR__SmallVector_00b02ef8;
  uVar27 = 0;
  local_160._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_180._16_4_ = res_id.data._M_elems;
  local_180._8_8_ = 1;
  result_1._M_dataplus._M_p._0_4_ = 1;
  result_1._M_string_length = (size_type)&PTR__SmallVector_00b02ef8;
  result_1.field_2._M_allocated_capacity = 0;
  local_130 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_180._24_8_ = local_180 + 0x10;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)&result_1._M_string_length,
             (SmallVector<unsigned_int,_2UL> *)local_180);
  sVar13 = name_str._M_string_length;
  result_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8[0] = local_b8[0] & 0xffffffff00000000;
  uVar32 = 0;
  do {
    uVar16 = 0;
    if (uVar32 < sVar13) {
      uVar16 = (uint)(byte)name_str._M_dataplus._M_p[uVar32];
    }
    uVar22 = (uint)uVar32 & 3;
    uVar27 = uVar27 | uVar16 << (char)uVar22 * '\b';
    local_b8[0] = CONCAT44(local_b8[0]._4_4_,uVar27);
    if (uVar22 == 3) {
      if (result_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          result_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&result_2,
                   (iterator)
                   result_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(uint *)local_b8);
      }
      else {
        *result_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar27;
        result_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             result_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_b8[0] = local_b8[0] & 0xffffffff00000000;
      uVar27 = 0;
    }
    uVar32 = uVar32 + 1;
  } while (uVar32 <= sVar13);
  if (((int)sVar13 + 1U & 3) != 0) {
    if (result_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        result_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&result_2,
                 (iterator)
                 result_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)local_b8);
    }
    else {
      *result_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = uVar27;
      result_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           result_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)local_78,&result_2);
  local_128[0] = 0xb;
  local_120._0_8_ = &PTR__SmallVector_00b02ef8;
  local_120._8_8_ = 0;
  local_120._24_8_ = local_120 + 0x10;
  local_100._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)local_120,(SmallVector<unsigned_int,_2UL> *)local_78)
  ;
  local_b8[0] = 0;
  local_b8[1] = 0;
  local_b8[2] = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)local_b8,
             &result_1,&result_2);
  Instruction::Instruction(pIVar19,pIVar6,OpName,0,0,(OperandList *)local_b8);
  local_c0._M_head_impl = pIVar19;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_b8);
  lVar23 = -0x60;
  this_00 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&local_100;
  do {
    *(undefined ***)(this_00 + -0x20) = &PTR__SmallVector_00b02ef8;
    if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_00 !=
        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                (this_00,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_00);
    }
    *(undefined8 *)this_00 = 0;
    this_00 = this_00 + -0x30;
    lVar23 = lVar23 + 0x30;
  } while (lVar23 != 0);
  local_78._0_8_ = &PTR__SmallVector_00b02ef8;
  if (local_58._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_58,local_58._M_head_impl);
  }
  local_58._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  if (result_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(result_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)result_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)result_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_180._0_8_ = &PTR__SmallVector_00b02ef8;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_160._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_160,local_160._M_head_impl);
  }
  inst._M_head_impl = local_c0._M_head_impl;
  pIVar6 = (this->super_Pass).context_;
  if ((pIVar6->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar6);
  }
  analysis::DefUseManager::AnalyzeInstDefUse
            ((pIVar6->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
             inst._M_head_impl);
  std::
  vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
  ::
  emplace_back<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
            ((vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
              *)&names_to_add,
             (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)&local_c0);
  if (local_c0._M_head_impl != (Instruction *)0x0) {
    (*((local_c0._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      _vptr_IntrusiveNodeBase[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name_str._M_dataplus._M_p != &name_str.field_2) {
    operator_delete(name_str._M_dataplus._M_p,
                    CONCAT71(name_str.field_2._M_allocated_capacity._1_7_,
                             name_str.field_2._M_local_buf[0]) + 1);
  }
  _Var21._M_node = (_Base_ptr)std::_Rb_tree_increment(pVar34.first._M_node._M_node);
  pVar34.second._M_node = local_d0._M_node;
  pVar34.first._M_node = _Var21._M_node;
  if (_Var21._M_node == local_d0._M_node) goto LAB_0055d2ba;
  goto LAB_0055cc0a;
code_r0x0055cf36:
  puVar31 = puVar31 + 1;
  goto LAB_0055cf06;
}

Assistant:

uint32_t DescriptorScalarReplacement::CreateReplacementVariable(
    Instruction* var, uint32_t idx) {
  // The storage class for the new variable is the same as the original.
  spv::StorageClass storage_class =
      static_cast<spv::StorageClass>(var->GetSingleWordInOperand(0));

  // The type for the new variable will be a pointer to type of the elements of
  // the array.
  uint32_t ptr_type_id = var->type_id();
  Instruction* ptr_type_inst = get_def_use_mgr()->GetDef(ptr_type_id);
  assert(ptr_type_inst->opcode() == spv::Op::OpTypePointer &&
         "Variable should be a pointer to an array or structure.");
  uint32_t pointee_type_id = ptr_type_inst->GetSingleWordInOperand(1);
  Instruction* pointee_type_inst = get_def_use_mgr()->GetDef(pointee_type_id);
  const bool is_array = pointee_type_inst->opcode() == spv::Op::OpTypeArray;
  const bool is_struct = pointee_type_inst->opcode() == spv::Op::OpTypeStruct;
  assert((is_array || is_struct) &&
         "Variable should be a pointer to an array or structure.");

  uint32_t element_type_id =
      is_array ? pointee_type_inst->GetSingleWordInOperand(0)
               : pointee_type_inst->GetSingleWordInOperand(idx);

  uint32_t ptr_element_type_id = context()->get_type_mgr()->FindPointerToType(
      element_type_id, storage_class);

  // Create the variable.
  uint32_t id = TakeNextId();
  std::unique_ptr<Instruction> variable(
      new Instruction(context(), spv::Op::OpVariable, ptr_element_type_id, id,
                      std::initializer_list<Operand>{
                          {SPV_OPERAND_TYPE_STORAGE_CLASS,
                           {static_cast<uint32_t>(storage_class)}}}));
  context()->AddGlobalValue(std::move(variable));

  CopyDecorationsForNewVariable(var, idx, id, ptr_element_type_id, is_array,
                                is_struct, pointee_type_inst);

  // Create a new OpName for the replacement variable.
  std::vector<std::unique_ptr<Instruction>> names_to_add;
  for (auto p : context()->GetNames(var->result_id())) {
    Instruction* name_inst = p.second;
    std::string name_str = utils::MakeString(name_inst->GetOperand(1).words);
    if (is_array) {
      name_str += "[" + utils::ToString(idx) + "]";
    }
    if (is_struct) {
      Instruction* member_name_inst =
          context()->GetMemberName(pointee_type_inst->result_id(), idx);
      name_str += ".";
      if (member_name_inst)
        name_str += utils::MakeString(member_name_inst->GetOperand(2).words);
      else
        // In case the member does not have a name assigned to it, use the
        // member index.
        name_str += utils::ToString(idx);
    }

    std::unique_ptr<Instruction> new_name(new Instruction(
        context(), spv::Op::OpName, 0, 0,
        std::initializer_list<Operand>{
            {SPV_OPERAND_TYPE_ID, {id}},
            {SPV_OPERAND_TYPE_LITERAL_STRING, utils::MakeVector(name_str)}}));
    Instruction* new_name_inst = new_name.get();
    get_def_use_mgr()->AnalyzeInstDefUse(new_name_inst);
    names_to_add.push_back(std::move(new_name));
  }

  // We shouldn't add the new names when we are iterating over name ranges
  // above. We can add all the new names now.
  for (auto& new_name : names_to_add)
    context()->AddDebug2Inst(std::move(new_name));

  return id;
}